

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O3

MixingHashState
absl::lts_20240722::hash_internal::HashStateBase<absl::lts_20240722::hash_internal::MixingHashState>
::combine<google::protobuf::Message_const*,std::__cxx11::string>
          (MixingHashState state,Message **value,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *values)

{
  size_t size;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  MixingHashState MVar4;
  uint64_t v_3;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)&((*value)->super_MessageLite)._vptr_MessageLite + state.state_;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)&((*value)->super_MessageLite)._vptr_MessageLite +
                 (SUB168(auVar1 * ZEXT816(0x9ddfea08eb382d69),0) ^
                 SUB168(auVar1 * ZEXT816(0x9ddfea08eb382d69),8));
  size = values->_M_string_length;
  MVar4 = MixingHashState::combine_contiguous
                    ((MixingHashState)
                     (SUB168(auVar2 * ZEXT816(0x9ddfea08eb382d69),8) ^
                     SUB168(auVar2 * ZEXT816(0x9ddfea08eb382d69),0)),
                     (uchar *)(values->_M_dataplus)._M_p,size);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = MVar4.state_ + size;
  return (MixingHashState)
         (SUB168(auVar3 * ZEXT816(0x9ddfea08eb382d69),0) ^
         SUB168(auVar3 * ZEXT816(0x9ddfea08eb382d69),8));
}

Assistant:

H HashStateBase<H>::combine(H state, const T& value, const Ts&... values) {
  return H::combine(hash_internal::HashSelect::template Apply<T>::Invoke(
                        std::move(state), value),
                    values...);
}